

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O1

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,large_printable *value)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  _func_void *p_Var4;
  void *pvVar5;
  printable_vtable temp;
  printable_vtable local_88;
  printable_vtable local_58;
  
  pdVar2 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_88.vtable_._M_elems[2] = print_wrapper<large_printable>::exec;
  local_88.vtable_._M_elems[0] = clone_impl<large_printable>;
  local_88.vtable_._M_elems[1] = delete_impl<large_printable>;
  local_88.get_value_ptr_ = get_value_ptr<true>;
  local_88.value_ = (void *)0x0;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  local_88.value_ = malloc(0x2018);
  *(pointer *)local_88.value_ = pdVar2;
  *(pointer *)((long)local_88.value_ + 8) = pdVar3;
  *(pointer *)((long)local_88.value_ + 0x10) = pdVar1;
  local_58.vtable_._M_elems[2] = print_wrapper<large_printable>::exec;
  local_58.vtable_._M_elems[0] = clone_impl<large_printable>;
  local_58.vtable_._M_elems[1] = delete_impl<large_printable>;
  local_58.get_value_ptr_ = get_value_ptr<true>;
  local_88.get_value_ptr_ = get_value_ptr<false>;
  local_58.value_ = local_88.value_;
  operator=(&local_88,this);
  operator=(this,&local_58);
  p_Var4 = local_58.vtable_._M_elems[1];
  if (local_58.get_value_ptr_ == get_value_ptr<true>) {
    pvVar5 = get_value_ptr<true>(&local_58);
    (*p_Var4)(pvVar5);
  }
  p_Var4 = local_88.vtable_._M_elems[1];
  if (local_88.get_value_ptr_ == get_value_ptr<true>) {
    pvVar5 = get_value_ptr<true>(&local_88);
    (*p_Var4)(pvVar5);
  }
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }